

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O1

void deqp::gles2::Functional::evalDiscardTexture(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<float,_2> res_1;
  Vector<float,_2> res;
  float afStack_50 [2];
  undefined8 local_48;
  float local_40;
  float local_38 [2];
  undefined8 local_30;
  float local_28;
  float local_20;
  float fStack_1c;
  float local_18;
  
  local_48 = *(undefined8 *)(c->coords).m_data;
  local_40 = (c->coords).m_data[2];
  _local_28 = &c->color;
  local_20 = 0.0;
  fStack_1c = 1.4013e-45;
  local_18 = 2.8026e-45;
  lVar1 = 2;
  do {
    _local_28->m_data[*(int *)((long)&stack0xffffffffffffffd8 + lVar1 * 4)] = afStack_50[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  local_30 = *(undefined8 *)(c->coords).m_data;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  lVar1 = 0;
  do {
    local_38[lVar1] = *(float *)((long)&local_30 + lVar1 * 4) * 0.25;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_48 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_48 + lVar1 * 4) = local_38[lVar1] + 0.5;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  afStack_50[0] = 2.1937207e-38;
  afStack_50[1] = 0.0;
  deqp::gls::ShaderEvalContext::texture2D
            ((ShaderEvalContext *)&stack0xffffffffffffffd8,(int)c,(Vec2 *)0x0);
  if (local_28 < 0.7) {
    c->isDiscarded = true;
  }
  return;
}

Assistant:

inline void evalDiscardTexture (ShaderEvalContext& c)
{
	c.color.xyz() = c.coords.swizzle(0,1,2);
	if (c.texture2D(0, c.coords.swizzle(0,1) * 0.25f + 0.5f).x() < 0.7f)
		c.discard();
}